

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

void __thiscall
soul::ArrayWithPreallocation<soul::Structure::Member,_8UL>::shrink
          (ArrayWithPreallocation<soul::Structure::Member,_8UL> *this,size_t newSize)

{
  Member *pMVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_t sVar4;
  
  if (newSize == 0) {
    clear(this);
    return;
  }
  if (newSize <= this->numActive) {
    while (newSize < this->numActive) {
      pMVar1 = this->items;
      sVar4 = this->numActive - 1;
      this->numActive = sVar4;
      paVar3 = &pMVar1[sVar4].name.field_2;
      pcVar2 = pMVar1[sVar4].name._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar3) {
        operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
      }
      RefCountedPtr<soul::Structure>::decIfNotNull(pMVar1[sVar4].type.structure.object);
    }
    return;
  }
  throwInternalCompilerError("newSize <= numActive","shrink",0xff);
}

Assistant:

void shrink (size_t newSize)
    {
        if (newSize == 0)
            return clear();

        SOUL_ASSERT (newSize <= numActive);

        while (newSize < numActive && numActive > 0)
            items[--numActive].~Item();
    }